

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::IsImplicitWeakField
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  string *psVar1;
  bool bVar2;
  Descriptor *pDVar3;
  SCC *pSVar4;
  SCC *pSVar5;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  bVar2 = UsingImplicitWeakFields(field->file_,options);
  if ((((bVar2) && (field->type_ == '\v')) && (bVar2 = FieldDescriptor::is_required(field), !bVar2))
     && ((bVar2 = FieldDescriptor::is_map(field), !bVar2 && ((field->field_0x1 & 8) == 0)))) {
    pDVar3 = FieldDescriptor::message_type(field);
    bVar2 = IsWellKnownMessage(pDVar3->file_);
    if (!bVar2) {
      pDVar3 = FieldDescriptor::message_type(field);
      psVar1 = pDVar3->file_->name_;
      __x._M_str = (psVar1->_M_dataplus)._M_p;
      __x._M_len = psVar1->_M_string_length;
      __y._M_str = "net/proto2/proto/descriptor.proto";
      __y._M_len = 0x21;
      bVar2 = std::operator!=(__x,__y);
      if (bVar2) {
        pSVar4 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                 GetSCC(&scc_analyzer->analyzer_,field->containing_type_);
        pDVar3 = FieldDescriptor::message_type(field);
        pSVar5 = SCCAnalyzer<google::protobuf::compiler::cpp::MessageSCCAnalyzer::DepsGenerator>::
                 GetSCC(&scc_analyzer->analyzer_,pDVar3);
        return pSVar4 != pSVar5;
      }
    }
  }
  return false;
}

Assistant:

bool IsImplicitWeakField(const FieldDescriptor* field, const Options& options,
                         MessageSCCAnalyzer* scc_analyzer) {
  return UsingImplicitWeakFields(field->file(), options) &&
         field->type() == FieldDescriptor::TYPE_MESSAGE &&
         !field->is_required() && !field->is_map() && !field->is_extension() &&
         !IsWellKnownMessage(field->message_type()->file()) &&
         field->message_type()->file()->name() !=
             "net/proto2/proto/descriptor.proto" &&
         // We do not support implicit weak fields between messages in the same
         // strongly-connected component.
         scc_analyzer->GetSCC(field->containing_type()) !=
             scc_analyzer->GetSCC(field->message_type());
}